

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall
dtc::fdt::property::property
          (property *this,text_input_buffer *input,string *k,string_set *l,bool semicolonTerminated,
          define_map *defines)

{
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  pointer pcVar1;
  element_type *peVar2;
  size_t sVar3;
  undefined4 uVar4;
  byte bVar5;
  _Elt_pointer psVar6;
  _Elt_pointer psVar7;
  int iVar8;
  _Elt_pointer psVar9;
  char *msg;
  bool bVar10;
  __alloc_node_gen_t __alloc_node_gen;
  string filename;
  source_location loc;
  value_type local_f8;
  string_set *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  source_location local_50;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar1 = (k->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + k->_M_string_length);
  local_f8.label._M_dataplus._M_p = (pointer)&this->labels;
  (this->labels)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->labels)._M_h._M_bucket_count = (l->_M_h)._M_bucket_count;
  (this->labels)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->labels)._M_h._M_element_count = (l->_M_h)._M_element_count;
  uVar4 = *(undefined4 *)&(l->_M_h)._M_rehash_policy.field_0x4;
  sVar3 = (l->_M_h)._M_rehash_policy._M_next_resize;
  (this->labels)._M_h._M_rehash_policy._M_max_load_factor =
       (l->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->labels)._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->labels)._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->labels)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_98 = (string_set *)local_f8.label._M_dataplus._M_p;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_f8.label._M_dataplus._M_p,&l->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_f8);
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->valid = true;
  this_00 = &input->input_stack;
  do {
    text_input_buffer::next_token(input);
    psVar6 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar6 == (input->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      bVar5 = 0;
    }
    else {
      if (psVar6 == (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar6 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar2 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar8 = peVar2->cursor;
      bVar5 = 0;
      if ((-1 < (long)iVar8) && (iVar8 < peVar2->size)) {
        bVar5 = peVar2->buffer[iVar8];
      }
    }
    if (bVar5 < 0x2f) {
      if (bVar5 == 0x22) {
        parse_string(this,input);
      }
      else if (bVar5 == 0x24) {
        parse_define(this,input,defines);
        if (this->valid == false) goto LAB_00122e15;
      }
      else {
        if (bVar5 != 0x26) {
LAB_00122e15:
          text_input_buffer::parse_error(input,"Invalid property value.");
          goto LAB_00122e35;
        }
        parse_reference(this,input);
      }
    }
    else if (bVar5 < 0x3c) {
      if (bVar5 == 0x2f) {
        bVar10 = text_input_buffer::consume(input,"/incbin/(\"");
        if (!bVar10) {
          local_f8.label._M_dataplus._M_p = (pointer)0x0;
          bVar10 = text_input_buffer::consume(input,"/bits/");
          this->valid = bVar10;
          text_input_buffer::next_token(input);
          bVar10 = text_input_buffer::consume_integer(input,(unsigned_long_long *)&local_f8);
          this->valid = (bool)(this->valid & bVar10);
          if ((7 < ((long)local_f8.label._M_dataplus._M_p << 0x3d |
                   (ulong)(local_f8.label._M_dataplus._M_p + -8) >> 3)) ||
             ((0x8bUL >> ((ulong)(local_f8.label._M_dataplus._M_p + -8) >> 3 & 0x3f) & 1) == 0)) {
            text_input_buffer::parse_error(input,"Invalid size for elements");
            this->valid = false;
          }
          if (this->valid != true) {
            return;
          }
          text_input_buffer::next_token(input);
          psVar6 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar6 != (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            if (psVar6 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar6 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar8 = peVar2->cursor;
            if (((-1 < (long)iVar8) && (iVar8 < peVar2->size)) && (peVar2->buffer[iVar8] == '<')) {
              parse_cells(this,input,(int)local_f8.label._M_dataplus._M_p);
              goto LAB_00122bdf;
            }
          }
          text_input_buffer::parse_error(input,"/bits/ directive is only valid on arrays");
          goto LAB_00122e35;
        }
        text_input_buffer::source_location::source_location(&local_50,input);
        text_input_buffer::parse_to_abi_cxx11_(&local_70,input,'\"');
        psVar6 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar7 == psVar6) {
          bVar10 = false;
        }
        else {
          psVar9 = psVar7;
          if (psVar7 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar9 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar2 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar8 = peVar2->cursor;
          bVar10 = false;
          if ((-1 < (long)iVar8) && (iVar8 < peVar2->size)) {
            bVar10 = peVar2->buffer[iVar8] == '\"';
          }
        }
        if (bVar10 == false) {
          this->valid = false;
LAB_00122b88:
          bVar10 = true;
          text_input_buffer::source_location::report_error
                    (&local_50,"Syntax error, expected \'\"\' to terminate /incbin/(");
        }
        else {
          if (psVar7 != psVar6) {
            input->cursor = input->cursor + 1;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar8 = peVar2->cursor + 1;
            peVar2->cursor = iVar8;
            if (peVar2->size <= iVar8) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          this->valid = bVar10;
          if (bVar10 == false) goto LAB_00122b88;
          local_88 = 0;
          local_80 = 0;
          local_f8.label._M_dataplus._M_p = (pointer)&local_f8.label.field_2;
          local_90 = &local_80;
          std::__cxx11::string::_M_construct<char*>((string *)&local_f8,&local_80,&local_80);
          local_f8.string_data._M_dataplus._M_p = (pointer)&local_f8.string_data.field_2;
          local_f8.string_data._M_string_length = 0;
          local_f8.string_data.field_2._M_local_buf[0] = '\0';
          local_f8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.type = UNKNOWN;
          if (local_90 != &local_80) {
            operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
          }
          bVar10 = text_input_buffer::read_binary_file(input,&local_70,&local_f8.byte_data);
          this->valid = bVar10;
          msg = "Cannot open binary include file";
          if (bVar10) {
            psVar6 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            psVar7 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar7 == psVar6) {
              bVar10 = false;
            }
            else {
              psVar9 = psVar7;
              if (psVar7 == (input->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar9 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar8 = peVar2->cursor;
              bVar10 = false;
              if ((-1 < (long)iVar8) && (bVar10 = false, iVar8 < peVar2->size)) {
                bVar10 = peVar2->buffer[iVar8] == ')';
              }
            }
            if ((psVar7 != psVar6) && (bVar10 != false)) {
              input->cursor = input->cursor + 1;
              if (psVar7 == (input->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar7 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar8 = peVar2->cursor + 1;
              peVar2->cursor = iVar8;
              if (peVar2->size <= iVar8) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
            }
            msg = "Syntax error, expected \')\' to terminate /incbin/(";
            bVar10 = (bool)(bVar10 & this->valid);
            this->valid = bVar10;
            if (bVar10 == false) goto LAB_00122d03;
            std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
            push_back(&this->values,&local_f8);
            bVar10 = false;
          }
          else {
LAB_00122d03:
            bVar10 = true;
            text_input_buffer::parse_error(input,msg);
          }
          if (local_f8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.byte_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.byte_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.byte_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.string_data._M_dataplus._M_p != &local_f8.string_data.field_2) {
            operator_delete(local_f8.string_data._M_dataplus._M_p,
                            CONCAT71(local_f8.string_data.field_2._M_allocated_capacity._1_7_,
                                     local_f8.string_data.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.label._M_dataplus._M_p != &local_f8.label.field_2) {
            operator_delete(local_f8.label._M_dataplus._M_p,
                            local_f8.label.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_50.b.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.b.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar10) {
          return;
        }
      }
      else if (bVar5 != 0x3b) goto LAB_00122e15;
    }
    else if (bVar5 == 0x3c) {
      parse_cells(this,input,0x20);
    }
    else {
      if (bVar5 != 0x5b) goto LAB_00122e15;
      parse_bytes(this,input);
    }
LAB_00122bdf:
    text_input_buffer::next_token(input);
    psVar6 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar7 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar7 == psVar6) {
      bVar10 = false;
    }
    else {
      psVar9 = psVar7;
      if (psVar7 == (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar9 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar2 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar8 = peVar2->cursor;
      bVar10 = false;
      if ((-1 < (long)iVar8) && (iVar8 < peVar2->size)) {
        bVar10 = peVar2->buffer[iVar8] == ',';
      }
    }
    if (!bVar10) break;
    if (psVar7 != psVar6) {
      input->cursor = input->cursor + 1;
      if (psVar7 == (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar8 = peVar2->cursor + 1;
      peVar2->cursor = iVar8;
      if (peVar2->size <= iVar8) {
        std::
        deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
        ::pop_back(&this_00->c);
      }
    }
  } while (bVar10);
  if (semicolonTerminated) {
    psVar6 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar7 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar7 == psVar6) {
      bVar10 = false;
    }
    else {
      psVar9 = psVar7;
      if (psVar7 == (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar9 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar2 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar8 = peVar2->cursor;
      bVar10 = false;
      if ((-1 < (long)iVar8) && (iVar8 < peVar2->size)) {
        bVar10 = peVar2->buffer[iVar8] == ';';
      }
    }
    if (bVar10) {
      if (psVar7 != psVar6) {
        input->cursor = input->cursor + 1;
        if (psVar7 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar7 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar8 = peVar2->cursor + 1;
        peVar2->cursor = iVar8;
        if (peVar2->size <= iVar8) {
          std::
          deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
          ::pop_back(&this_00->c);
        }
      }
      if (bVar10) {
        return;
      }
    }
    text_input_buffer::parse_error(input,"Expected ; at end of property");
LAB_00122e35:
    this->valid = false;
  }
  return;
}

Assistant:

property::property(text_input_buffer &input,
                   string &&k,
                   string_set &&l,
                   bool semicolonTerminated,
                   define_map *defines) : key(k), labels(l), valid(true)
{
	do {
		input.next_token();
		switch (*input)
		{
			case '$':
			{
				parse_define(input, defines);
				if (valid)
				{
					break;
				}
			}
			[[fallthrough]];
			default:
				input.parse_error("Invalid property value.");
				valid = false;
				return;
			case '/':
			{
				if (input.consume("/incbin/(\""))
				{
					auto loc = input.location();
					std::string filename = input.parse_to('"');
					if (!(valid = input.consume('"')))
					{
						loc.report_error("Syntax error, expected '\"' to terminate /incbin/(");
						return;
					}
					property_value v;
					if (!(valid = input.read_binary_file(filename, v.byte_data)))
					{
						input.parse_error("Cannot open binary include file");
						return;
					}
					if (!(valid &= input.consume(')')))
					{
						input.parse_error("Syntax error, expected ')' to terminate /incbin/(");
						return;
					}
					values.push_back(v);
					break;
				}
				unsigned long long bits = 0;
				valid = input.consume("/bits/");
				input.next_token();
				valid &= input.consume_integer(bits);
				if ((bits != 8) &&
				    (bits != 16) &&
				    (bits != 32) &&
				    (bits != 64)) {
					input.parse_error("Invalid size for elements");
					valid = false;
				}
				if (!valid) return;
				input.next_token();
				if (*input != '<')
				{
					input.parse_error("/bits/ directive is only valid on arrays");
					valid = false;
					return;
				}
				parse_cells(input, bits);
				break;
			}
			case '"':
				parse_string(input);
				break;
			case '<':
				parse_cells(input, 32);
				break;
			case '[':
				parse_bytes(input);
				break;
			case '&':
				parse_reference(input);
				break;
			case ';':
			{
				break;
			}
		}
		input.next_token();
	} while (input.consume(','));
	if (semicolonTerminated && !input.consume(';'))
	{
		input.parse_error("Expected ; at end of property");
		valid = false;
	}
}